

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_download_rate(session_impl *this)

{
  peer_class_t c;
  int iVar1;
  session_impl *this_local;
  
  iVar1 = session_settings::get_int(&this->m_settings,0x404f);
  if (iVar1 < 0) {
    session_settings::set_int(&this->m_settings,0x404f,0);
  }
  c.m_val = (this->m_global_class).m_val;
  iVar1 = session_settings::get_int(&this->m_settings,0x404f);
  set_download_rate_limit(this,c,iVar1);
  return;
}

Assistant:

void session_impl::update_download_rate()
	{
		if (m_settings.get_int(settings_pack::download_rate_limit) < 0)
			m_settings.set_int(settings_pack::download_rate_limit, 0);
		set_download_rate_limit(m_global_class
			, m_settings.get_int(settings_pack::download_rate_limit));
	}